

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O0

int comp(void *elem1,void *elem2)

{
  unsigned_long s;
  unsigned_long f;
  void *elem2_local;
  void *elem1_local;
  undefined4 local_4;
  
  if (*(uint *)((long)elem2 + 0x80) < *(uint *)((long)elem1 + 0x80)) {
    local_4 = 1;
  }
  else if (*(uint *)((long)elem1 + 0x80) < *(uint *)((long)elem2 + 0x80)) {
    local_4 = -1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int comp(const void *elem1, const void *elem2)
{
    unsigned long f = ((struct snif*)elem1)->current.can_id;
    unsigned long s = ((struct snif*)elem2)->current.can_id;

    if (f > s)
	    return  1;
    if (f < s)
	    return -1;

    return 0;
}